

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O1

PaUtilAllocationGroup * PaUtil_CreateAllocationGroup(void)

{
  PaUtilAllocationGroupLink *pPVar1;
  PaUtilAllocationGroup *pPVar2;
  PaUtilAllocationGroupLink *in_RDX;
  
  pPVar2 = (PaUtilAllocationGroup *)0x0;
  pPVar1 = AllocateLinks(0x10,(PaUtilAllocationGroupLink *)0x0,in_RDX);
  if (pPVar1 != (PaUtilAllocationGroupLink *)0x0) {
    pPVar2 = (PaUtilAllocationGroup *)PaUtil_AllocateMemory(0x20);
    if (pPVar2 == (PaUtilAllocationGroup *)0x0) {
      PaUtil_FreeMemory(pPVar1);
      pPVar2 = (PaUtilAllocationGroup *)0x0;
    }
    else {
      pPVar2->linkCount = 0x10;
      pPVar2->linkBlocks = pPVar1;
      pPVar2->spareLinks = pPVar1 + 1;
      pPVar2->allocations = (PaUtilAllocationGroupLink *)0x0;
    }
  }
  return pPVar2;
}

Assistant:

PaUtilAllocationGroup* PaUtil_CreateAllocationGroup( void )
{
    PaUtilAllocationGroup* result = 0;
    struct PaUtilAllocationGroupLink *links;


    links = AllocateLinks( PA_INITIAL_LINK_COUNT_, 0, 0 );
    if( links != 0 )
    {
        result = (PaUtilAllocationGroup*)PaUtil_AllocateMemory( sizeof(PaUtilAllocationGroup) );
        if( result )
        {
            result->linkCount = PA_INITIAL_LINK_COUNT_;
            result->linkBlocks = &links[0];
            result->spareLinks = &links[1];
            result->allocations = 0;
        }
        else
        {
            PaUtil_FreeMemory( links );
        }
    }

    return result;
}